

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_oct
          (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *this)

{
  uint uVar1;
  undefined1 n [16];
  format_specs specs;
  int iVar2;
  long in_RDI;
  undefined8 unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  bin_writer<3> in_stack_00000020;
  int num_digits;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  long lVar3;
  
  n._8_8_ = in_stack_ffffffffffffff60;
  n._0_8_ = in_stack_ffffffffffffff58;
  lVar3 = in_RDI;
  iVar2 = count_digits<3u,unsigned__int128>(*(internal **)(in_RDI + 0x10),(unsigned___int128)n);
  if (((*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') &&
      (*(int *)(*(long *)(in_RDI + 8) + 4) <= iVar2)) &&
     (*(long *)(in_RDI + 0x10) != 0 || *(long *)(in_RDI + 0x18) != 0)) {
    uVar1 = *(uint *)(in_RDI + 0x24);
    *(uint *)(in_RDI + 0x24) = uVar1 + 1;
    *(undefined1 *)(in_RDI + 0x20 + (ulong)uVar1) = 0x30;
  }
  get_prefix((int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *)0x18fdf2);
  specs._8_8_ = unaff_retaddr;
  specs.width = (int)lVar3;
  specs.precision = (int)((ulong)lVar3 >> 0x20);
  basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
  ::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::bin_writer<3>>
            ((basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
              *)CONCAT44(iVar2,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
             (string_view)in_stack_00000008,specs,in_stack_00000020);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>(abs_value);
      if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<3>{abs_value, num_digits});
    }